

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

int __thiscall rcg::System::close(System *this,int __fd)

{
  int iVar1;
  __shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::recursive_mutex::lock(&this->mtx);
  if ((0 < this->n_open) && (iVar1 = this->n_open + -1, this->n_open = iVar1, iVar1 == 0)) {
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->TLClose)(this->tl);
    this->tl = (void *)0x0;
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->nodemap).
                super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar1;
}

Assistant:

void System::close()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open > 0)
  {
    n_open--;

    if (n_open == 0)
    {
      gentl->TLClose(tl);
      tl=0;

      nodemap=0;
      cport=0;
    }
  }
}